

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  d_derived_tbl *htbl;
  boolean bVar3;
  uint nbits;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  jpeg_source_mgr *pjVar7;
  int bits_left;
  long lVar8;
  _func_void_j_decompress_ptr *get_buffer;
  uint uVar9;
  bitread_working_state br_state;
  savable_state state;
  bitread_working_state local_80;
  undefined8 local_58;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Stack_50;
  undefined4 local_48;
  long local_40;
  JBLOCKROW local_38;
  
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Al;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar3 = process_restart(cinfo), bVar3 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      pjVar7 = cinfo->src;
      local_80.next_input_byte = pjVar7->next_input_byte;
      local_80.bytes_in_buffer = pjVar7->bytes_in_buffer;
      get_buffer = pjVar2[1].start_pass;
      bits_left = *(int *)&pjVar2[1].decode_mcu;
      local_48 = *(undefined4 *)&pjVar2[3].start_pass;
      local_58 = pjVar2[2].start_pass;
      p_Stack_50 = pjVar2[2].decode_mcu;
      if (0 < cinfo->blocks_in_MCU) {
        lVar8 = 0;
        local_80.cinfo = cinfo;
        do {
          local_38 = MCU_data[lVar8];
          local_40 = (long)cinfo->MCU_membership[lVar8];
          htbl = (d_derived_tbl *)
                 (&pjVar2[4].start_pass)
                 [cinfo->cur_comp_info[cinfo->MCU_membership[lVar8]]->dc_tbl_no];
          if (bits_left < 8) {
            bVar3 = jpeg_fill_bit_buffer(&local_80,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar3 == 0) {
              return 0;
            }
            get_buffer = (_func_void_j_decompress_ptr *)local_80.get_buffer;
            bits_left = local_80.bits_left;
            if (7 < local_80.bits_left) goto LAB_0027f9e9;
            nbits = jpeg_huff_decode(&local_80,local_80.get_buffer,local_80.bits_left,htbl,1);
LAB_0027fa26:
            get_buffer = (_func_void_j_decompress_ptr *)local_80.get_buffer;
            bits_left = local_80.bits_left;
            if ((int)nbits < 0) goto LAB_0027fb09;
          }
          else {
LAB_0027f9e9:
            uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (htbl->look_nbits[uVar6] == 0) {
              nbits = jpeg_huff_decode(&local_80,(bit_buf_type)get_buffer,bits_left,htbl,9);
              goto LAB_0027fa26;
            }
            nbits = (uint)htbl->look_sym[uVar6];
            bits_left = bits_left - htbl->look_nbits[uVar6];
          }
          if (nbits == 0) {
            iVar5 = 0;
          }
          else {
            if ((bits_left < (int)nbits) &&
               (bVar3 = jpeg_fill_bit_buffer(&local_80,(bit_buf_type)get_buffer,bits_left,nbits),
               get_buffer = (_func_void_j_decompress_ptr *)local_80.get_buffer,
               bits_left = local_80.bits_left, bVar3 == 0)) goto LAB_0027fb09;
            bits_left = bits_left - nbits;
            uVar4 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[nbits];
            uVar9 = 0;
            if ((int)uVar4 <= bmask[nbits - 1]) {
              uVar9 = bmask[nbits];
            }
            iVar5 = uVar4 - uVar9;
          }
          iVar5 = iVar5 + *(int *)((long)&local_58 + local_40 * 4 + 4);
          *(int *)((long)&local_58 + local_40 * 4 + 4) = iVar5;
          (*local_38)[0] = (JCOEF)(iVar5 << ((byte)iVar1 & 0x1f));
          lVar8 = lVar8 + 1;
        } while (lVar8 < cinfo->blocks_in_MCU);
        pjVar7 = cinfo->src;
      }
      pjVar7->next_input_byte = local_80.next_input_byte;
      pjVar7->bytes_in_buffer = local_80.bytes_in_buffer;
      pjVar2[1].start_pass = get_buffer;
      *(int *)&pjVar2[1].decode_mcu = bits_left;
      *(undefined4 *)&pjVar2[3].start_pass = local_48;
      pjVar2[2].start_pass = local_58;
      pjVar2[2].decode_mcu = p_Stack_50;
    }
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    bVar3 = 1;
  }
  else {
LAB_0027fb09:
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF) (entropy->last_dc_val[ci] << cinfo->Al);
  }

  return TRUE;
}